

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesQueueBindSparseTests.cpp
# Opt level: O0

void vkt::sparse::anon_unknown_2::populateTestGroup(TestCaseGroup *group)

{
  string *psVar1;
  SparseQueueBindTest *this;
  TestContext *testCtx;
  long lVar2;
  __0 *local_908;
  int local_610;
  int caseNdx;
  allocator<char> local_604;
  undefined1 local_603;
  allocator<char> local_602;
  allocator<char> local_601;
  undefined1 local_600;
  allocator<char> local_5ff;
  allocator<char> local_5fe;
  undefined1 local_5fd;
  allocator<char> local_5fc;
  allocator<char> local_5fb;
  undefined1 local_5fa;
  allocator<char> local_5f9;
  allocator<char> local_5f8;
  undefined1 local_5f7;
  allocator<char> local_5f6;
  allocator<char> local_5f5;
  undefined1 local_5f4;
  allocator<char> local_5f3;
  allocator<char> local_5f2;
  undefined1 local_5f1;
  allocator<char> local_5f0;
  allocator<char> local_5ef;
  undefined1 local_5ee;
  allocator<char> local_5ed;
  allocator<char> local_5ec;
  undefined1 local_5eb;
  allocator<char> local_5ea;
  allocator<char> local_5e9;
  undefined1 local_5e8;
  allocator<char> local_5e7;
  allocator<char> local_5e6;
  undefined1 local_5e5;
  allocator<char> local_5e4;
  allocator<char> local_5e3;
  undefined1 local_5e2;
  allocator<char> local_5e1;
  allocator<char> local_5e0;
  undefined1 local_5df;
  allocator<char> local_5de;
  allocator<char> local_5dd;
  undefined1 local_5dc;
  allocator<char> local_5db;
  allocator<char> local_5da;
  undefined1 local_5d9;
  allocator<char> local_5d8;
  allocator<char> local_5d7;
  undefined1 local_5d6;
  allocator<char> local_5d5 [20];
  allocator<char> local_5c1;
  string *local_5c0;
  string local_5b8 [8];
  anon_struct_80_3_ef64809c cases [18];
  TestCaseGroup *group_local;
  
  local_5c0 = local_5b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_5b8,"no_dependency",&local_5c1);
  local_5d6 = 1;
  cases[0].name.field_2._8_4_ = 1;
  cases[0].name.field_2._12_4_ = 0;
  cases[0].params.numQueues = 0;
  cases[0].params.numWaitSemaphores._0_1_ = 0;
  cases[0].params.numWaitSemaphores._1_1_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cases[0].params.numSignalSemaphores,"submit without any semaphores",
             local_5d5);
  local_5d6 = 0;
  psVar1 = (string *)(cases[0].description.field_2._M_local_buf + 8);
  local_5c0 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(psVar1,"no_dependency_fence",&local_5d7);
  local_5d9 = 1;
  cases[1].name.field_2._8_4_ = 1;
  cases[1].name.field_2._12_4_ = 0;
  cases[1].params.numQueues = 0;
  cases[1].params.numWaitSemaphores._0_1_ = 0;
  cases[1].params.numWaitSemaphores._1_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cases[1].params.numSignalSemaphores,
             "submit without any semaphores, signal a fence",&local_5d8);
  local_5d9 = 0;
  psVar1 = (string *)(cases[1].description.field_2._M_local_buf + 8);
  local_5c0 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(psVar1,"single_queue_wait_one",&local_5da);
  local_5dc = 1;
  cases[2].name.field_2._8_4_ = 1;
  cases[2].name.field_2._12_4_ = 1;
  cases[2].params.numQueues = 0;
  cases[2].params.numWaitSemaphores._0_1_ = 0;
  cases[2].params.numWaitSemaphores._1_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cases[2].params.numSignalSemaphores,
             "only sparse queue, wait for semaphore(s)",&local_5db);
  local_5dc = 0;
  psVar1 = (string *)(cases[2].description.field_2._M_local_buf + 8);
  local_5c0 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(psVar1,"single_queue_wait_many",&local_5dd);
  local_5df = 1;
  cases[3].name.field_2._8_4_ = 1;
  cases[3].name.field_2._12_4_ = 3;
  cases[3].params.numQueues = 0;
  cases[3].params.numWaitSemaphores._0_1_ = 0;
  cases[3].params.numWaitSemaphores._1_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cases[3].params.numSignalSemaphores,
             "only sparse queue, wait for semaphore(s)",&local_5de);
  local_5df = 0;
  psVar1 = (string *)(cases[3].description.field_2._M_local_buf + 8);
  local_5c0 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(psVar1,"single_queue_signal_one",&local_5e0);
  local_5e2 = 1;
  cases[4].name.field_2._8_4_ = 1;
  cases[4].name.field_2._12_4_ = 0;
  cases[4].params.numQueues = 1;
  cases[4].params.numWaitSemaphores._0_1_ = 0;
  cases[4].params.numWaitSemaphores._1_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cases[4].params.numSignalSemaphores,"only sparse queue, signal semaphore(s)"
             ,&local_5e1);
  local_5e2 = 0;
  psVar1 = (string *)(cases[4].description.field_2._M_local_buf + 8);
  local_5c0 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(psVar1,"single_queue_signal_many",&local_5e3);
  local_5e5 = 1;
  cases[5].name.field_2._8_4_ = 1;
  cases[5].name.field_2._12_4_ = 0;
  cases[5].params.numQueues = 3;
  cases[5].params.numWaitSemaphores._0_1_ = 0;
  cases[5].params.numWaitSemaphores._1_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cases[5].params.numSignalSemaphores,"only sparse queue, signal semaphore(s)"
             ,&local_5e4);
  local_5e5 = 0;
  psVar1 = (string *)(cases[5].description.field_2._M_local_buf + 8);
  local_5c0 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (psVar1,"single_queue_wait_one_signal_one",&local_5e6);
  local_5e8 = 1;
  cases[6].name.field_2._8_4_ = 1;
  cases[6].name.field_2._12_4_ = 1;
  cases[6].params.numQueues = 1;
  cases[6].params.numWaitSemaphores._0_1_ = 0;
  cases[6].params.numWaitSemaphores._1_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cases[6].params.numSignalSemaphores,
             "only sparse queue, wait for and signal semaphore(s)",&local_5e7);
  local_5e8 = 0;
  psVar1 = (string *)(cases[6].description.field_2._M_local_buf + 8);
  local_5c0 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (psVar1,"single_queue_wait_many_signal_many",&local_5e9);
  local_5eb = 1;
  cases[7].name.field_2._8_4_ = 1;
  cases[7].name.field_2._12_4_ = 2;
  cases[7].params.numQueues = 3;
  cases[7].params.numWaitSemaphores._0_1_ = 0;
  cases[7].params.numWaitSemaphores._1_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cases[7].params.numSignalSemaphores,
             "only sparse queue, wait for and signal semaphore(s)",&local_5ea);
  local_5eb = 0;
  psVar1 = (string *)(cases[7].description.field_2._M_local_buf + 8);
  local_5c0 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(psVar1,"multi_queue_wait_one",&local_5ec);
  local_5ee = 1;
  cases[8].name.field_2._8_4_ = 2;
  cases[8].name.field_2._12_4_ = 1;
  cases[8].params.numQueues = 0;
  cases[8].params.numWaitSemaphores._0_1_ = 0;
  cases[8].params.numWaitSemaphores._1_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cases[8].params.numSignalSemaphores,
             "sparse and other queues, wait for semaphore(s)",&local_5ed);
  local_5ee = 0;
  psVar1 = (string *)(cases[8].description.field_2._M_local_buf + 8);
  local_5c0 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(psVar1,"multi_queue_wait_many",&local_5ef);
  local_5f1 = 1;
  cases[9].name.field_2._8_4_ = 2;
  cases[9].name.field_2._12_4_ = 2;
  cases[9].params.numQueues = 0;
  cases[9].params.numWaitSemaphores._0_1_ = 0;
  cases[9].params.numWaitSemaphores._1_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cases[9].params.numSignalSemaphores,
             "sparse and other queues, wait for semaphore(s)",&local_5f0);
  local_5f1 = 0;
  psVar1 = (string *)(cases[9].description.field_2._M_local_buf + 8);
  local_5c0 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(psVar1,"multi_queue_signal_one",&local_5f2);
  local_5f4 = 1;
  cases[10].name.field_2._8_4_ = 2;
  cases[10].name.field_2._12_4_ = 0;
  cases[10].params.numQueues = 1;
  cases[10].params.numWaitSemaphores._0_1_ = 0;
  cases[10].params.numWaitSemaphores._1_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cases[10].params.numSignalSemaphores,
             "sparse and other queues, signal semaphore(s)",&local_5f3);
  local_5f4 = 0;
  psVar1 = (string *)(cases[10].description.field_2._M_local_buf + 8);
  local_5c0 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(psVar1,"multi_queue_signal_many",&local_5f5);
  local_5f7 = 1;
  cases[0xb].name.field_2._8_4_ = 2;
  cases[0xb].name.field_2._12_4_ = 0;
  cases[0xb].params.numQueues = 2;
  cases[0xb].params.numWaitSemaphores._0_1_ = 0;
  cases[0xb].params.numWaitSemaphores._1_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cases[0xb].params.numSignalSemaphores,
             "sparse and other queues, signal semaphore(s)",&local_5f6);
  local_5f7 = 0;
  psVar1 = (string *)(cases[0xb].description.field_2._M_local_buf + 8);
  local_5c0 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (psVar1,"multi_queue_wait_one_signal_one",&local_5f8);
  local_5fa = 1;
  cases[0xc].name.field_2._8_4_ = 2;
  cases[0xc].name.field_2._12_4_ = 1;
  cases[0xc].params.numQueues = 1;
  cases[0xc].params.numWaitSemaphores._0_1_ = 0;
  cases[0xc].params.numWaitSemaphores._1_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cases[0xc].params.numSignalSemaphores,
             "sparse and other queues, wait for and signal semaphore(s)",&local_5f9);
  local_5fa = 0;
  psVar1 = (string *)(cases[0xc].description.field_2._M_local_buf + 8);
  local_5c0 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (psVar1,"multi_queue_wait_many_signal_many",&local_5fb);
  local_5fd = 1;
  cases[0xd].name.field_2._8_4_ = 2;
  cases[0xd].name.field_2._12_4_ = 2;
  cases[0xd].params.numQueues = 2;
  cases[0xd].params.numWaitSemaphores._0_1_ = 0;
  cases[0xd].params.numWaitSemaphores._1_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cases[0xd].params.numSignalSemaphores,
             "sparse and other queues, wait for and signal semaphore(s)",&local_5fc);
  local_5fd = 0;
  psVar1 = (string *)(cases[0xd].description.field_2._M_local_buf + 8);
  local_5c0 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (psVar1,"multi_queue_wait_one_signal_one_other",&local_5fe);
  local_600 = 1;
  cases[0xe].name.field_2._8_4_ = 2;
  cases[0xe].name.field_2._12_4_ = 1;
  cases[0xe].params.numQueues = 1;
  cases[0xe].params.numWaitSemaphores._0_1_ = 0;
  cases[0xe].params.numWaitSemaphores._1_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cases[0xe].params.numSignalSemaphores,
             "sparse and other queues, wait for and signal semaphore(s) on other queues",&local_5ff)
  ;
  local_600 = 0;
  psVar1 = (string *)(cases[0xe].description.field_2._M_local_buf + 8);
  local_5c0 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (psVar1,"multi_queue_wait_many_signal_many_other",&local_601);
  local_603 = 1;
  cases[0xf].name.field_2._8_4_ = 3;
  cases[0xf].name.field_2._12_4_ = 2;
  cases[0xf].params.numQueues = 2;
  cases[0xf].params.numWaitSemaphores._0_1_ = 0;
  cases[0xf].params.numWaitSemaphores._1_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cases[0xf].params.numSignalSemaphores,
             "sparse and other queues, wait for and signal semaphore(s) on other queues",&local_602)
  ;
  local_603 = 0;
  psVar1 = (string *)(cases[0xf].description.field_2._M_local_buf + 8);
  local_5c0 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(psVar1,"empty",&local_604);
  caseNdx._2_1_ = 1;
  cases[0x10].name.field_2._8_4_ = 1;
  cases[0x10].name.field_2._12_4_ = 0;
  cases[0x10].params.numQueues = 0;
  cases[0x10].params.numWaitSemaphores._0_1_ = 1;
  cases[0x10].params.numWaitSemaphores._1_1_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cases[0x10].params.numSignalSemaphores,
             "call vkQueueBindSparse with zero bindInfos",(allocator<char> *)((long)&caseNdx + 3));
  caseNdx._2_1_ = 0;
  psVar1 = (string *)(cases[0x10].description.field_2._M_local_buf + 8);
  local_5c0 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (psVar1,"empty_fence",(allocator<char> *)((long)&caseNdx + 1));
  cases[0x11].name.field_2._8_4_ = 1;
  cases[0x11].name.field_2._12_4_ = 0;
  cases[0x11].params.numQueues = 0;
  cases[0x11].params.numWaitSemaphores._0_1_ = 1;
  cases[0x11].params.numWaitSemaphores._1_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cases[0x11].params.numSignalSemaphores,
             "call vkQueueBindSparse with zero bindInfos, signal a fence",
             (allocator<char> *)&caseNdx);
  std::allocator<char>::~allocator((allocator<char> *)&caseNdx);
  std::allocator<char>::~allocator((allocator<char> *)((long)&caseNdx + 1));
  std::allocator<char>::~allocator((allocator<char> *)((long)&caseNdx + 3));
  std::allocator<char>::~allocator(&local_604);
  std::allocator<char>::~allocator(&local_602);
  std::allocator<char>::~allocator(&local_601);
  std::allocator<char>::~allocator(&local_5ff);
  std::allocator<char>::~allocator(&local_5fe);
  std::allocator<char>::~allocator(&local_5fc);
  std::allocator<char>::~allocator(&local_5fb);
  std::allocator<char>::~allocator(&local_5f9);
  std::allocator<char>::~allocator(&local_5f8);
  std::allocator<char>::~allocator(&local_5f6);
  std::allocator<char>::~allocator(&local_5f5);
  std::allocator<char>::~allocator(&local_5f3);
  std::allocator<char>::~allocator(&local_5f2);
  std::allocator<char>::~allocator(&local_5f0);
  std::allocator<char>::~allocator(&local_5ef);
  std::allocator<char>::~allocator(&local_5ed);
  std::allocator<char>::~allocator(&local_5ec);
  std::allocator<char>::~allocator(&local_5ea);
  std::allocator<char>::~allocator(&local_5e9);
  std::allocator<char>::~allocator(&local_5e7);
  std::allocator<char>::~allocator(&local_5e6);
  std::allocator<char>::~allocator(&local_5e4);
  std::allocator<char>::~allocator(&local_5e3);
  std::allocator<char>::~allocator(&local_5e1);
  std::allocator<char>::~allocator(&local_5e0);
  std::allocator<char>::~allocator(&local_5de);
  std::allocator<char>::~allocator(&local_5dd);
  std::allocator<char>::~allocator(&local_5db);
  std::allocator<char>::~allocator(&local_5da);
  std::allocator<char>::~allocator(&local_5d8);
  std::allocator<char>::~allocator(&local_5d7);
  std::allocator<char>::~allocator(local_5d5);
  std::allocator<char>::~allocator(&local_5c1);
  for (local_610 = 0; local_610 < 0x12; local_610 = local_610 + 1) {
    this = (SparseQueueBindTest *)operator_new(0x80);
    testCtx = tcu::TestNode::getTestContext(&group->super_TestNode);
    lVar2 = (long)local_610;
    SparseQueueBindTest::SparseQueueBindTest
              (this,testCtx,(string *)((long)&cases[lVar2 + -1].description.field_2 + 8),
               (string *)&cases[lVar2].params.numSignalSemaphores,
               (TestParams *)((long)&cases[lVar2].name.field_2 + 8));
    tcu::TestNode::addChild(&group->super_TestNode,(TestNode *)this);
  }
  local_908 = (__0 *)(cases[0x11].description.field_2._M_local_buf + 8);
  do {
    local_908 = local_908 + -0x50;
    sparse::(anonymous_namespace)::populateTestGroup(tcu::TestCaseGroup*)::$_0::~__0(local_908);
  } while (local_908 != (__0 *)local_5b8);
  return;
}

Assistant:

void populateTestGroup(tcu::TestCaseGroup* group)
{
	const struct
	{
		std::string		name;
		TestParams		params;
		std::string		description;
	} cases[] =
	{
		// case name									// numQueues, numWaitSems, numSignalSems, emptySubmission, checkFence
		{ "no_dependency",								{	1u,	0u,	0u,	false,	false,	}, "submit without any semaphores", },
		{ "no_dependency_fence",						{	1u,	0u,	0u,	false,	true,	}, "submit without any semaphores, signal a fence", },

		{ "single_queue_wait_one",						{	1u,	1u,	0u,	false,	true,	}, "only sparse queue, wait for semaphore(s)", },
		{ "single_queue_wait_many",						{	1u,	3u,	0u,	false,	true,	}, "only sparse queue, wait for semaphore(s)", },
		{ "single_queue_signal_one",					{	1u,	0u,	1u,	false,	true,	}, "only sparse queue, signal semaphore(s)", },
		{ "single_queue_signal_many",					{	1u,	0u,	3u,	false,	true,	}, "only sparse queue, signal semaphore(s)", },
		{ "single_queue_wait_one_signal_one",			{	1u,	1u,	1u,	false,	true,	}, "only sparse queue, wait for and signal semaphore(s)", },
		{ "single_queue_wait_many_signal_many",			{	1u,	2u,	3u,	false,	true,	}, "only sparse queue, wait for and signal semaphore(s)", },

		{ "multi_queue_wait_one",						{	2u,	1u,	0u,	false,	true,	}, "sparse and other queues, wait for semaphore(s)", },
		{ "multi_queue_wait_many",						{	2u,	2u,	0u,	false,	true,	}, "sparse and other queues, wait for semaphore(s)", },
		{ "multi_queue_signal_one",						{	2u,	0u,	1u,	false,	true,	}, "sparse and other queues, signal semaphore(s)", },
		{ "multi_queue_signal_many",					{	2u,	0u,	2u,	false,	true,	}, "sparse and other queues, signal semaphore(s)", },
		{ "multi_queue_wait_one_signal_one",			{	2u,	1u,	1u,	false,	true,	}, "sparse and other queues, wait for and signal semaphore(s)", },
		{ "multi_queue_wait_many_signal_many",			{	2u,	2u,	2u,	false,	true,	}, "sparse and other queues, wait for and signal semaphore(s)", },
		{ "multi_queue_wait_one_signal_one_other",		{	2u,	1u,	1u,	false,	true,	}, "sparse and other queues, wait for and signal semaphore(s) on other queues", },
		{ "multi_queue_wait_many_signal_many_other",	{	3u,	2u,	2u,	false,	true,	}, "sparse and other queues, wait for and signal semaphore(s) on other queues", },

		{ "empty",										{	1u,	0u,	0u,	true,	false,	}, "call vkQueueBindSparse with zero bindInfos", },
		{ "empty_fence",								{	1u,	0u,	0u,	true,	true,	}, "call vkQueueBindSparse with zero bindInfos, signal a fence", },
	};

	for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(cases); ++caseNdx)
		group->addChild(new SparseQueueBindTest(group->getTestContext(), cases[caseNdx].name, cases[caseNdx].description, cases[caseNdx].params));
}